

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int get_drl_refmv_count(MACROBLOCK *x,MV_REFERENCE_FRAME *ref_frame,PREDICTION_MODE mode)

{
  int8_t iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  PREDICTION_MODE in_DL;
  long in_RDI;
  int ref_set;
  int has_drl;
  int only_newmv;
  int ref_mv_count;
  int has_nearmv;
  int8_t ref_frame_type;
  MB_MODE_INFO_EXT *mbmi_ext;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_40;
  bool local_3b;
  
  iVar1 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  iVar2 = have_nearmv_in_inter_mode(in_DL);
  uVar3 = (uint)(iVar2 != 0);
  uVar4 = (uint)*(byte *)(in_RDI + 0x40f8 + (long)iVar1);
  if ((uVar3 == 0) || (local_3b = true, uVar4 < 3)) {
    local_3b = (in_DL == '\x10' || in_DL == '\x18') && 1 < uVar4;
  }
  if (local_3b) {
    if ((int)(uVar4 - uVar3) < 4) {
      local_40 = uVar4 - uVar3;
    }
    else {
      local_40 = 3;
    }
  }
  else {
    local_40 = 1;
  }
  return local_40;
}

Assistant:

static int get_drl_refmv_count(const MACROBLOCK *const x,
                               const MV_REFERENCE_FRAME *ref_frame,
                               PREDICTION_MODE mode) {
  const MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const int8_t ref_frame_type = av1_ref_frame_type(ref_frame);
  const int has_nearmv = have_nearmv_in_inter_mode(mode) ? 1 : 0;
  const int ref_mv_count = mbmi_ext->ref_mv_count[ref_frame_type];
  const int only_newmv = (mode == NEWMV || mode == NEW_NEWMV);
  const int has_drl =
      (has_nearmv && ref_mv_count > 2) || (only_newmv && ref_mv_count > 1);
  const int ref_set =
      has_drl ? AOMMIN(MAX_REF_MV_SEARCH, ref_mv_count - has_nearmv) : 1;

  return ref_set;
}